

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

size_t __thiscall geometrycentral::surface::SurfaceMesh::nConnectedComponents(SurfaceMesh *this)

{
  size_type sVar1;
  byte bVar2;
  pointer puVar3;
  unsigned_long uVar4;
  pointer puVar5;
  pointer puVar6;
  unsigned_long uVar7;
  size_t sVar8;
  size_t sVar9;
  DisjointSets dj;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  distinctComponents;
  VertexData<size_t> vertInd;
  size_t local_e8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_e0;
  DisjointSets local_d8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_a0;
  VertexData<size_t> local_68;
  
  getVertexIndices(&local_68,this);
  DisjointSets::DisjointSets(&local_d8,this->nVerticesCount);
  sVar9 = this->nEdgesFillCount;
  if (sVar9 != 0) {
    puVar3 = (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar6 = puVar3;
    if (this->useImplicitTwinFlag != false) {
      puVar6 = puVar5;
    }
    if (*puVar6 == 0xffffffffffffffff) {
      sVar8 = 0;
      do {
        puVar3 = puVar3 + 1;
        puVar5 = puVar5 + 2;
        if (sVar9 - 1 == sVar8) goto LAB_00160b48;
        puVar6 = puVar3;
        if (this->useImplicitTwinFlag != false) {
          puVar6 = puVar5;
        }
        sVar8 = sVar8 + 1;
      } while (*puVar6 == 0xffffffffffffffff);
      goto LAB_00160b3f;
    }
  }
  sVar8 = 0;
LAB_00160b3f:
  if (sVar8 != sVar9) {
    bVar2 = this->useImplicitTwinFlag;
    do {
      if ((bVar2 & 1) == 0) {
        uVar7 = (this->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar8];
        puVar3 = (this->heVertexArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar4 = puVar3[uVar7];
        uVar7 = (this->heSiblingArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
      }
      else {
        puVar3 = (this->heVertexArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = sVar8 * 2 + 1;
        uVar4 = puVar3[sVar8 * 2];
      }
      DisjointSets::merge(&local_d8,
                          local_68.data.
                          super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data[uVar4],
                          local_68.data.
                          super_PlainObjectBase<Eigen::Matrix<unsigned_long,__1,_1,_0,__1,_1>_>.
                          m_storage.m_data[puVar3[uVar7]]);
      bVar2 = this->useImplicitTwinFlag;
      puVar3 = (this->eHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + sVar8 + 1;
      puVar5 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start + sVar8 * 2 + 2;
      do {
        if (sVar9 - 1 == sVar8) goto LAB_00160b48;
        puVar6 = puVar3;
        if ((bVar2 & 1) != 0) {
          puVar6 = puVar5;
        }
        puVar3 = puVar3 + 1;
        puVar5 = puVar5 + 2;
        sVar8 = sVar8 + 1;
      } while (*puVar6 == 0xffffffffffffffff);
    } while (sVar9 != sVar8);
  }
LAB_00160b48:
  local_a0._M_buckets = &local_a0._M_single_bucket;
  local_a0._M_bucket_count = 1;
  local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0._M_element_count = 0;
  local_a0._M_rehash_policy._M_max_load_factor = 1.0;
  local_a0._M_rehash_policy._M_next_resize = 0;
  local_a0._M_single_bucket = (__node_base_ptr)0x0;
  if (this->nVerticesCount != 0) {
    sVar9 = 0;
    do {
      local_e8 = DisjointSets::find(&local_d8,sVar9);
      local_e0 = &local_a0;
      ::std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_a0,&local_e8,&local_e0);
      sVar9 = sVar9 + 1;
    } while (sVar9 < this->nVerticesCount);
  }
  sVar1 = local_a0._M_element_count;
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_a0);
  if (local_d8.rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.rank.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.parent.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.parent.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  MeshData<geometrycentral::surface::Vertex,_unsigned_long>::~MeshData(&local_68);
  return sVar1;
}

Assistant:

size_t SurfaceMesh::nConnectedComponents() {
  VertexData<size_t> vertInd = getVertexIndices();
  DisjointSets dj(nVertices());
  for (Edge e : edges()) {
    dj.merge(vertInd[e.halfedge().vertex()], vertInd[e.halfedge().twin().vertex()]);
  }
  std::unordered_set<size_t> distinctComponents;
  for (size_t i = 0; i < nVertices(); i++) {
    distinctComponents.insert(dj.find(i));
  }
  return distinctComponents.size();
}